

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O3

void sha512_sw_write(BinarySink *bs,void *vp,size_t len)

{
  BinarySink **ppBVar1;
  ulong uVar2;
  ulong uVar3;
  BinarySink *pBVar4;
  long lVar5;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var6;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var7;
  BinarySink *pBVar8;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var9;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var10;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var11;
  code *pcVar12;
  BinarySink *pBVar13;
  ulong uVar14;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *p_Var15;
  _func_void_BinarySink_ptr_void_ptr_size_t *p_Var16;
  BinarySink **ppBVar17;
  uint64_t w [80];
  ulong auStack_330 [2];
  BinarySink **local_320;
  BinarySink *local_318;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_310;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_308;
  BinarySink *local_300;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_2f8;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_2f0;
  BinarySink *local_2e8;
  _func_void_BinarySink_ptr_void_ptr_size_t *local_2e0;
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *local_2d8;
  void *local_2d0;
  ulong local_2c8;
  size_t local_2c0;
  ulong local_2b8 [9];
  _func_void_BinarySink_ptr_char_ptr___va_list_tag_ptr *ap_Stack_270 [5];
  ulong auStack_248 [67];
  
  if (len != 0) {
    ppBVar17 = &bs[-7].binarysink_;
    local_320 = ppBVar17;
    local_318 = bs;
    do {
      uVar14 = 0x80 - (long)bs[-1].write;
      if (len < uVar14) {
        uVar14 = len;
      }
      auStack_330[0] = 0x12df77;
      memcpy(bs[-1].write + (long)ppBVar17,vp,uVar14);
      pBVar4 = local_318;
      p_Var9 = bs[-1].write;
      bs[-1].write = p_Var9 + uVar14;
      ppBVar1 = &bs[-1].binarysink_;
      pBVar8 = *ppBVar1;
      *ppBVar1 = (BinarySink *)(&(*ppBVar1)->write + uVar14);
      bs[-1].writefmtv = bs[-1].writefmtv + CARRY8((ulong)pBVar8,uVar14 * 8);
      local_2c0 = uVar14;
      if (p_Var9 + uVar14 == (_func_void_BinarySink_ptr_void_ptr_size_t *)0x80) {
        bs[-1].write = (_func_void_BinarySink_ptr_void_ptr_size_t *)0x0;
        lVar5 = 0;
        do {
          uVar14 = *(ulong *)((long)bs + lVar5 * 8 + -0x98);
          local_2b8[lVar5] =
               uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
               (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
               (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28
               | uVar14 << 0x38;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x10);
        lVar5 = 0x10;
        uVar14 = local_2b8[0];
        do {
          uVar2 = auStack_330[lVar5];
          uVar3 = (&local_2c8)[lVar5];
          local_2b8[lVar5] =
               (ulong)((&local_2f0)[lVar5] +
                      (uVar3 >> 6 ^ (uVar3 << 3 | uVar3 >> 0x3d) ^ (uVar3 << 0x2d | uVar3 >> 0x13))
                      + (uVar2 >> 7 ^
                        (uVar2 << 0x38 | uVar2 >> 8) ^
                        (uVar2 >> 1 | (ulong)((uVar2 & 1) != 0) << 0x3f)) + uVar14);
          lVar5 = lVar5 + 1;
          uVar14 = uVar2;
        } while (lVar5 != 0x50);
        local_310 = bs[-9].write;
        local_308 = bs[-9].writefmtv;
        local_300 = bs[-9].binarysink_;
        local_2f8 = bs[-8].write;
        local_2f0 = bs[-8].writefmtv;
        local_2e8 = bs[-8].binarysink_;
        local_2e0 = bs[-7].write;
        local_2d8 = bs[-7].writefmtv;
        uVar14 = 0xfffffffffffffff8;
        p_Var6 = local_308;
        pBVar8 = local_300;
        p_Var9 = local_2e0;
        p_Var10 = local_310;
        p_Var11 = local_2d8;
        pBVar13 = local_2e8;
        p_Var15 = local_2f0;
        p_Var16 = local_2f8;
        do {
          p_Var16 = p_Var16 + (long)(p_Var11 +
                                    local_2b8[uVar14 + 8] +
                                    sha512_round_constants[uVar14 + 8] +
                                    (((long)p_Var15 << 0x17 | (ulong)p_Var15 >> 0x29) ^
                                    ((long)p_Var15 << 0x2e | (ulong)p_Var15 >> 0x12) ^
                                    ((long)p_Var15 << 0x32 | (ulong)p_Var15 >> 0xe)) +
                                    (((ulong)pBVar13 ^ (ulong)p_Var9) & (ulong)p_Var15 ^
                                    (ulong)p_Var9));
          p_Var11 = p_Var11 + local_2b8[uVar14 + 8] +
                              sha512_round_constants[uVar14 + 8] +
                              (((long)p_Var15 << 0x17 | (ulong)p_Var15 >> 0x29) ^
                              ((long)p_Var15 << 0x2e | (ulong)p_Var15 >> 0x12) ^
                              ((long)p_Var15 << 0x32 | (ulong)p_Var15 >> 0xe)) +
                              (((ulong)pBVar13 ^ (ulong)p_Var9) & (ulong)p_Var15 ^ (ulong)p_Var9) +
                    (((ulong)p_Var10 | (ulong)p_Var6) & (ulong)pBVar8 |
                    (ulong)p_Var10 & (ulong)p_Var6) +
                    (((long)p_Var10 << 0x19 | (ulong)p_Var10 >> 0x27) ^
                    ((long)p_Var10 << 0x1e | (ulong)p_Var10 >> 0x22) ^
                    ((long)p_Var10 << 0x24 | (ulong)p_Var10 >> 0x1c));
          p_Var7 = (_func_void_BinarySink_ptr_void_ptr_size_t *)
                   ((long)&pBVar8->write +
                   (long)(p_Var9 + (((long)p_Var16 * 0x800000 | (ulong)p_Var16 >> 0x29) ^
                                   ((long)p_Var16 << 0x2e | (ulong)p_Var16 >> 0x12) ^
                                   ((long)p_Var16 << 0x32 | (ulong)p_Var16 >> 0xe)) +
                                   (((ulong)p_Var15 ^ (ulong)pBVar13) & (ulong)p_Var16 ^
                                   (ulong)pBVar13) +
                                   local_2b8[uVar14 + 9] + sha512_round_constants[uVar14 + 9]));
          p_Var9 = p_Var9 + (((long)p_Var16 * 0x800000 | (ulong)p_Var16 >> 0x29) ^
                            ((long)p_Var16 << 0x2e | (ulong)p_Var16 >> 0x12) ^
                            ((long)p_Var16 << 0x32 | (ulong)p_Var16 >> 0xe)) +
                            (((ulong)p_Var15 ^ (ulong)pBVar13) & (ulong)p_Var16 ^ (ulong)pBVar13) +
                            local_2b8[uVar14 + 9] + sha512_round_constants[uVar14 + 9] +
                   (((ulong)p_Var11 | (ulong)p_Var10) & (ulong)p_Var6 |
                   (ulong)p_Var11 & (ulong)p_Var10) +
                   (((long)p_Var11 * 0x2000000 | (ulong)p_Var11 >> 0x27) ^
                   ((long)p_Var11 * 0x40000000 | (ulong)p_Var11 >> 0x22) ^
                   ((long)p_Var11 << 0x24 | (ulong)p_Var11 >> 0x1c));
          pcVar12 = (code *)((long)&pBVar13->write +
                            (((long)p_Var7 * 0x800000 | (ulong)p_Var7 >> 0x29) ^
                            ((long)p_Var7 << 0x2e | (ulong)p_Var7 >> 0x12) ^
                            ((long)p_Var7 << 0x32 | (ulong)p_Var7 >> 0xe)) +
                            (((ulong)p_Var16 ^ (ulong)p_Var15) & (ulong)p_Var7 ^ (ulong)p_Var15) +
                            local_2b8[uVar14 + 10] + sha512_round_constants[uVar14 + 10]);
          p_Var6 = p_Var6 + (long)pcVar12;
          pcVar12 = pcVar12 + (((ulong)p_Var9 | (ulong)p_Var11) & (ulong)p_Var10 |
                              (ulong)p_Var9 & (ulong)p_Var11) +
                              (((long)p_Var9 * 0x2000000 | (ulong)p_Var9 >> 0x27) ^
                              ((long)p_Var9 * 0x40000000 | (ulong)p_Var9 >> 0x22) ^
                              ((long)p_Var9 << 0x24 | (ulong)p_Var9 >> 0x1c));
          p_Var10 = p_Var10 + (long)(p_Var15 +
                                    (((long)p_Var6 * 0x800000 | (ulong)p_Var6 >> 0x29) ^
                                    ((long)p_Var6 << 0x2e | (ulong)p_Var6 >> 0x12) ^
                                    ((long)p_Var6 << 0x32 | (ulong)p_Var6 >> 0xe)) +
                                    (((ulong)p_Var7 ^ (ulong)p_Var16) & (ulong)p_Var6 ^
                                    (ulong)p_Var16) +
                                    local_2b8[uVar14 + 0xb] + sha512_round_constants[uVar14 + 0xb]);
          p_Var15 = p_Var15 + (((long)p_Var6 * 0x800000 | (ulong)p_Var6 >> 0x29) ^
                              ((long)p_Var6 << 0x2e | (ulong)p_Var6 >> 0x12) ^
                              ((long)p_Var6 << 0x32 | (ulong)p_Var6 >> 0xe)) +
                              (((ulong)p_Var7 ^ (ulong)p_Var16) & (ulong)p_Var6 ^ (ulong)p_Var16) +
                              local_2b8[uVar14 + 0xb] + sha512_round_constants[uVar14 + 0xb] +
                    (((ulong)pcVar12 | (ulong)p_Var9) & (ulong)p_Var11 |
                    (ulong)pcVar12 & (ulong)p_Var9) +
                    (((long)pcVar12 * 0x2000000 | (ulong)pcVar12 >> 0x27) ^
                    ((long)pcVar12 * 0x40000000 | (ulong)pcVar12 >> 0x22) ^
                    ((long)pcVar12 << 0x24 | (ulong)pcVar12 >> 0x1c));
          p_Var11 = p_Var11 + (long)(p_Var16 +
                                    (((long)p_Var10 * 0x800000 | (ulong)p_Var10 >> 0x29) ^
                                    ((long)p_Var10 << 0x2e | (ulong)p_Var10 >> 0x12) ^
                                    ((long)p_Var10 << 0x32 | (ulong)p_Var10 >> 0xe)) +
                                    (((ulong)p_Var6 ^ (ulong)p_Var7) & (ulong)p_Var10 ^
                                    (ulong)p_Var7) +
                                    local_2b8[uVar14 + 0xc] + sha512_round_constants[uVar14 + 0xc]);
          p_Var16 = p_Var16 + (((long)p_Var10 * 0x800000 | (ulong)p_Var10 >> 0x29) ^
                              ((long)p_Var10 << 0x2e | (ulong)p_Var10 >> 0x12) ^
                              ((long)p_Var10 << 0x32 | (ulong)p_Var10 >> 0xe)) +
                              (((ulong)p_Var6 ^ (ulong)p_Var7) & (ulong)p_Var10 ^ (ulong)p_Var7) +
                              local_2b8[uVar14 + 0xc] + sha512_round_constants[uVar14 + 0xc] +
                    (((ulong)p_Var15 | (ulong)pcVar12) & (ulong)p_Var9 |
                    (ulong)p_Var15 & (ulong)pcVar12) +
                    (((long)p_Var15 * 0x2000000 | (ulong)p_Var15 >> 0x27) ^
                    ((long)p_Var15 * 0x40000000 | (ulong)p_Var15 >> 0x22) ^
                    ((long)p_Var15 << 0x24 | (ulong)p_Var15 >> 0x1c));
          p_Var9 = p_Var9 + (long)(p_Var7 + (((long)p_Var11 * 0x800000 | (ulong)p_Var11 >> 0x29) ^
                                            ((long)p_Var11 << 0x2e | (ulong)p_Var11 >> 0x12) ^
                                            ((long)p_Var11 << 0x32 | (ulong)p_Var11 >> 0xe)) +
                                            (((ulong)p_Var10 ^ (ulong)p_Var6) & (ulong)p_Var11 ^
                                            (ulong)p_Var6) +
                                            local_2b8[uVar14 + 0xd] +
                                            sha512_round_constants[uVar14 + 0xd]);
          pBVar8 = (BinarySink *)
                   (p_Var7 + (((long)p_Var11 * 0x800000 | (ulong)p_Var11 >> 0x29) ^
                             ((long)p_Var11 << 0x2e | (ulong)p_Var11 >> 0x12) ^
                             ((long)p_Var11 << 0x32 | (ulong)p_Var11 >> 0xe)) +
                             (((ulong)p_Var10 ^ (ulong)p_Var6) & (ulong)p_Var11 ^ (ulong)p_Var6) +
                             local_2b8[uVar14 + 0xd] + sha512_round_constants[uVar14 + 0xd] +
                   (((ulong)p_Var16 | (ulong)p_Var15) & (ulong)pcVar12 |
                   (ulong)p_Var16 & (ulong)p_Var15) +
                   (((long)p_Var16 * 0x2000000 | (ulong)p_Var16 >> 0x27) ^
                   ((long)p_Var16 * 0x40000000 | (ulong)p_Var16 >> 0x22) ^
                   ((long)p_Var16 << 0x24 | (ulong)p_Var16 >> 0x1c)));
          pBVar13 = (BinarySink *)
                    (p_Var6 + (((long)p_Var9 * 0x800000 | (ulong)p_Var9 >> 0x29) ^
                              ((long)p_Var9 << 0x2e | (ulong)p_Var9 >> 0x12) ^
                              ((long)p_Var9 << 0x32 | (ulong)p_Var9 >> 0xe)) +
                              (((ulong)p_Var11 ^ (ulong)p_Var10) & (ulong)p_Var9 ^ (ulong)p_Var10) +
                              local_2b8[uVar14 + 0xe] + sha512_round_constants[uVar14 + 0xe] +
                    (long)pcVar12);
          p_Var6 = p_Var6 + (((long)p_Var9 * 0x800000 | (ulong)p_Var9 >> 0x29) ^
                            ((long)p_Var9 << 0x2e | (ulong)p_Var9 >> 0x12) ^
                            ((long)p_Var9 << 0x32 | (ulong)p_Var9 >> 0xe)) +
                            (((ulong)p_Var11 ^ (ulong)p_Var10) & (ulong)p_Var9 ^ (ulong)p_Var10) +
                            local_2b8[uVar14 + 0xe] + sha512_round_constants[uVar14 + 0xe] +
                   (((ulong)pBVar8 | (ulong)p_Var16) & (ulong)p_Var15 |
                   (ulong)pBVar8 & (ulong)p_Var16) +
                   (((long)pBVar8 * 0x2000000 | (ulong)pBVar8 >> 0x27) ^
                   ((long)pBVar8 * 0x40000000 | (ulong)pBVar8 >> 0x22) ^
                   ((long)pBVar8 << 0x24 | (ulong)pBVar8 >> 0x1c));
          p_Var15 = p_Var15 + (long)(p_Var10 +
                                    (((long)pBVar13 * 0x800000 | (ulong)pBVar13 >> 0x29) ^
                                    ((long)pBVar13 << 0x2e | (ulong)pBVar13 >> 0x12) ^
                                    ((long)pBVar13 << 0x32 | (ulong)pBVar13 >> 0xe)) +
                                    (((ulong)p_Var9 ^ (ulong)p_Var11) & (ulong)pBVar13 ^
                                    (ulong)p_Var11) +
                                    local_2b8[uVar14 + 0xf] + sha512_round_constants[uVar14 + 0xf]);
          p_Var10 = p_Var10 + (((long)pBVar13 * 0x800000 | (ulong)pBVar13 >> 0x29) ^
                              ((long)pBVar13 << 0x2e | (ulong)pBVar13 >> 0x12) ^
                              ((long)pBVar13 << 0x32 | (ulong)pBVar13 >> 0xe)) +
                              (((ulong)p_Var9 ^ (ulong)p_Var11) & (ulong)pBVar13 ^ (ulong)p_Var11) +
                              local_2b8[uVar14 + 0xf] + sha512_round_constants[uVar14 + 0xf] +
                    (((ulong)p_Var6 | (ulong)pBVar8) & (ulong)p_Var16 |
                    (ulong)p_Var6 & (ulong)pBVar8) +
                    (((long)p_Var6 * 0x2000000 | (ulong)p_Var6 >> 0x27) ^
                    ((long)p_Var6 * 0x40000000 | (ulong)p_Var6 >> 0x22) ^
                    ((long)p_Var6 << 0x24 | (ulong)p_Var6 >> 0x1c));
          uVar14 = uVar14 + 8;
        } while (uVar14 < 0x48);
        local_318[-9].write = p_Var10 + (long)local_310;
        local_318[-9].writefmtv = p_Var6 + (long)local_308;
        local_318[-9].binarysink_ = (BinarySink *)((long)&local_300->write + (long)&pBVar8->write);
        local_318[-8].write = p_Var16 + (long)local_2f8;
        local_318[-8].writefmtv = p_Var15 + (long)local_2f0;
        local_318[-8].binarysink_ = (BinarySink *)((long)&local_2e8->write + (long)&pBVar13->write);
        local_318[-7].write = p_Var9 + (long)local_2e0;
        local_318[-7].writefmtv = p_Var11 + (long)local_2d8;
        auStack_330[0] = 0x12e4ba;
        local_2d0 = vp;
        local_2c8 = len;
        smemclr(local_2b8,0x280);
        len = local_2c8;
        bs = pBVar4;
        vp = local_2d0;
        ppBVar17 = local_320;
      }
      vp = (void *)((long)vp + local_2c0);
      len = len - local_2c0;
    } while (len != 0);
  }
  return;
}

Assistant:

static void sha512_sw_write(BinarySink *bs, const void *vp, size_t len)
{
    sha512_sw *s = BinarySink_DOWNCAST(bs, sha512_sw);

    while (len > 0)
        if (sha512_block_write(&s->blk, &vp, &len))
            sha512_sw_block(s->core, s->blk.block);
}